

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O1

int op_make_decode_ready(OggOpusFile *_of)

{
  int iVar1;
  int iVar2;
  int iVar3;
  OggOpusLink *pOVar4;
  int iVar5;
  long lVar6;
  OpusMSDecoder *pOVar7;
  uchar *__src;
  int err;
  undefined1 local_34 [4];
  
  if (3 < _of->ready_state) {
    return 0;
  }
  if (_of->ready_state == 3) {
    if (_of->seekable == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (long)_of->cur_link;
    }
    pOVar4 = _of->links;
    iVar1 = pOVar4[lVar6].head.channel_count;
    iVar2 = pOVar4[lVar6].head.stream_count;
    iVar3 = pOVar4[lVar6].head.coupled_count;
    pOVar7 = _of->od;
    if ((((pOVar7 == (OpusMSDecoder *)0x0) || (_of->od_stream_count != iVar2)) ||
        (_of->od_coupled_count != iVar3)) ||
       ((_of->od_channel_count != iVar1 ||
        (iVar5 = bcmp(_of->od_mapping,pOVar4[lVar6].head.mapping,(long)iVar1), iVar5 != 0)))) {
      opus_multistream_decoder_destroy(pOVar7);
      __src = pOVar4[lVar6].head.mapping;
      pOVar7 = (OpusMSDecoder *)
               opus_multistream_decoder_create(48000,iVar1,iVar2,iVar3,__src,local_34);
      _of->od = pOVar7;
      if (pOVar7 == (OpusMSDecoder *)0x0) {
        return -0x81;
      }
      _of->od_stream_count = iVar2;
      _of->od_coupled_count = iVar3;
      _of->od_channel_count = iVar1;
      memcpy(_of->od_mapping,__src,(long)iVar1);
    }
    else {
      opus_multistream_decoder_ctl(pOVar7,0xfbc);
    }
    _of->ready_state = 4;
    _of->state_channel_count = 0;
    _of->bytes_tracked = 0;
    _of->samples_tracked = 0;
    _of->dither_seed = _of->links[lVar6].serialno;
    op_update_gain(_of);
    return 0;
  }
  return -0x81;
}

Assistant:

static int op_make_decode_ready(OggOpusFile *_of){
  const OpusHead *head;
  int             li;
  int             stream_count;
  int             coupled_count;
  int             channel_count;
  if(_of->ready_state>OP_STREAMSET)return 0;
  if(OP_UNLIKELY(_of->ready_state<OP_STREAMSET))return OP_EFAULT;
  li=_of->seekable?_of->cur_link:0;
  head=&_of->links[li].head;
  stream_count=head->stream_count;
  coupled_count=head->coupled_count;
  channel_count=head->channel_count;
  /*Check to see if the current decoder is compatible with the current link.*/
  if(_of->od!=NULL&&_of->od_stream_count==stream_count
   &&_of->od_coupled_count==coupled_count&&_of->od_channel_count==channel_count
   &&memcmp(_of->od_mapping,head->mapping,
   sizeof(*head->mapping)*channel_count)==0){
    opus_multistream_decoder_ctl(_of->od,OPUS_RESET_STATE);
  }
  else{
    int err;
    opus_multistream_decoder_destroy(_of->od);
    _of->od=opus_multistream_decoder_create(48000,channel_count,
     stream_count,coupled_count,head->mapping,&err);
    if(_of->od==NULL)return OP_EFAULT;
    _of->od_stream_count=stream_count;
    _of->od_coupled_count=coupled_count;
    _of->od_channel_count=channel_count;
    memcpy(_of->od_mapping,head->mapping,sizeof(*head->mapping)*channel_count);
  }
  _of->ready_state=OP_INITSET;
  _of->bytes_tracked=0;
  _of->samples_tracked=0;
#if !defined(OP_FIXED_POINT)
  _of->state_channel_count=0;
  /*Use the serial number for the PRNG seed to get repeatable output for
     straight play-throughs.*/
  _of->dither_seed=_of->links[li].serialno;
#endif
  op_update_gain(_of);
  return 0;
}